

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

string * __thiscall
soul::TokenisedPathString::getParentPath_abi_cxx11_
          (string *__return_storage_ptr__,TokenisedPathString *this)

{
  string local_30;
  
  if ((this->sections).numActive < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
    choc::text::trim(__return_storage_ptr__,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getParentPath() const
    {
        if (sections.size() <= 1)
            return {};

        return choc::text::trim (fullPath.substr (0, sections[sections.size() - 2].end));
    }